

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O3

void SoPlex_addRowReal(void *soplex,double *rowentries,int rowsize,int nnonzeros,double lb,double ub
                      )

{
  uint n;
  ulong uVar1;
  DSVectorBase<double> local_88;
  LPRowBase<double> local_68;
  
  local_88.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  local_88.super_SVectorBase<double>.memsize = 0;
  local_88.super_SVectorBase<double>.memused = 0;
  local_88._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  local_88.theelem = (Nonzero<double> *)0x0;
  n = 2;
  if (0 < nnonzeros) {
    n = nnonzeros;
  }
  ::soplex::spx_alloc<soplex::Nonzero<double>*>(&local_88.theelem,n);
  local_88.super_SVectorBase<double>.m_elem = local_88.theelem;
  local_88.super_SVectorBase<double>.memused = 0;
  local_88.super_SVectorBase<double>.memsize = n;
  if (0 < rowsize) {
    uVar1 = 0;
    do {
      if ((*rowentries != 0.0) || (NAN(*rowentries))) {
        ::soplex::DSVectorBase<double>::add(&local_88,(int)uVar1,rowentries);
      }
      uVar1 = uVar1 + 1;
      rowentries = rowentries + 1;
    } while ((uint)rowsize != uVar1);
  }
  local_68.object = 0.0;
  local_68.left = lb;
  local_68.right = ub;
  ::soplex::DSVectorBase<double>::DSVectorBase<double>
            (&local_68.vec,&local_88.super_SVectorBase<double>);
  ::soplex::SoPlexBase<double>::addRowReal((SoPlexBase<double> *)soplex,&local_68);
  local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
    free(local_68.vec.theelem);
  }
  local_88._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  if (local_88.theelem != (Nonzero<double> *)0x0) {
    free(local_88.theelem);
  }
  return;
}

Assistant:

void SoPlex_addRowReal(void* soplex, double* rowentries, int rowsize, int nnonzeros, double lb,
                       double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector row(nnonzeros);

   /* add nonzero entries to row vector */
   for(int i = 0; i < rowsize; ++i)
   {
      if(rowentries[i] != 0.0)
         row.add(i, rowentries[i]);
   }

   so->addRowReal(LPRow(lb, row, ub));
}